

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O2

double ON_BoundingBoxTolerance(int dim,double *bboxmin,double *bboxmax)

{
  double *pdVar1;
  double *pdVar2;
  ulong uVar3;
  char *sFormat;
  int line_number;
  double dVar4;
  double dVar5;
  
  if ((bboxmax == (double *)0x0 || bboxmin == (double *)0x0) || dim < 1) {
    sFormat = "dim > 0 && bboxmin != nullptr && bboxmax != nullptr is false";
    line_number = 0xc09;
  }
  else {
    uVar3 = 0;
    do {
      if ((uint)dim == uVar3) {
        dVar4 = ON_ArrayDistance(dim,bboxmin,bboxmax);
        dVar4 = dVar4 * 2.220446049250313e-16;
        for (uVar3 = 0; (uint)dim != uVar3; uVar3 = uVar3 + 1) {
          dVar5 = (bboxmax[uVar3] - bboxmin[uVar3]) * 1.490116119385e-08;
          if (dVar5 <= dVar4) {
            dVar5 = dVar4;
          }
          dVar4 = (ABS(bboxmax[uVar3]) - ABS(bboxmin[uVar3])) * 2.220446049250313e-16;
          if (dVar4 <= dVar5) {
            dVar4 = dVar5;
          }
        }
        dVar5 = 2.3283064365386963e-10;
        if (2.3283064365386963e-10 <= dVar4) {
          dVar5 = dVar4;
        }
        return (double)(~-(ulong)(0.0 < dVar4) & (ulong)dVar4 | (ulong)dVar5 & -(ulong)(0.0 < dVar4)
                       );
      }
      pdVar1 = bboxmax + uVar3;
      pdVar2 = bboxmin + uVar3;
      uVar3 = uVar3 + 1;
    } while (*pdVar2 <= *pdVar1);
    sFormat = "bboxmin[i] <= bboxmax[i] is false";
    line_number = 0xc0b;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_bounding_box.cpp"
             ,line_number,"",sFormat);
  return 0.0;
}

Assistant:

double ON_BoundingBoxTolerance(
        int dim,
        const double* bboxmin,
        const double* bboxmax
        )
{
  int i;
  double x, tolerance=0.0;

#if defined(ON_COMPILER_MSC)
#pragma ON_PRAGMA_WARNING_PUSH
// Disable the MSC /W4 "conditional expression is constant" warning
// generated by the do {...} while(0) in the ON_ASSERT_OR_RETURN macro.
#pragma ON_PRAGMA_WARNING_DISABLE_MSC( 4127 )
#endif

  ON_ASSERT_OR_RETURN( dim > 0 && bboxmin != nullptr && bboxmax != nullptr,tolerance);
  for ( i = 0; i < dim; i++ ) {
    ON_ASSERT_OR_RETURN(bboxmin[i] <= bboxmax[i],tolerance);
  }

#if defined(ON_COMPILER_MSC)
#pragma ON_PRAGMA_WARNING_POP
#endif

  tolerance = ON_ArrayDistance(dim,bboxmin,bboxmax)*ON_EPSILON;
  for ( i = 0; i < dim; i++ ) {
    x = (bboxmax[i] - bboxmin[i])*ON_SQRT_EPSILON;
    if ( x > tolerance )
      tolerance = x;
    x = (fabs(bboxmax[i]) - fabs(bboxmin[i]))*ON_EPSILON;
    if ( x > tolerance )
      tolerance = x;
  }
  if ( tolerance > 0.0 && tolerance < ON_ZERO_TOLERANCE )
    tolerance = ON_ZERO_TOLERANCE;
  return tolerance;
}